

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple8b.h
# Opt level: O0

void __thiscall FastPForLib::Simple8b<true>::~Simple8b(Simple8b<true> *this)

{
  void *in_RDI;
  
  ~Simple8b((Simple8b<true> *)0x1495d8);
  operator_delete(in_RDI);
  return;
}

Assistant:

static bool tryme(const uint32_t *n, size_t len) {
    if (log1 >= 32)
      return true;
    const uint32_t minv =
        (static_cast<uint32_t>(len) < num1) ? static_cast<uint32_t>(len) : num1;
    for (uint32_t i = 0; i < minv; i++) {
      if (n[i] >= (1U << (log1 % 32)))
        return false;
    }
    return true;
  }